

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O2

void duckdb_je_jemalloc_prefork(void)

{
  tsd_t *tsd;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  tsd = (tsd_t *)__tls_get_addr(&PTR_027f6b60);
  if ((tsd->state).repr != '\0') {
    tsd = duckdb_je_tsd_fetch_slow(tsd,false);
  }
  uVar2 = (ulong)narenas_total.repr;
  duckdb_je_witness_prefork(&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_witness_tsd)
  ;
  duckdb_je_ctl_prefork((tsdn_t *)tsd);
  duckdb_je_tcache_prefork((tsdn_t *)tsd);
  duckdb_je_malloc_mutex_prefork((tsdn_t *)tsd,&duckdb_je_arenas_lock);
  duckdb_je_background_thread_prefork0((tsdn_t *)tsd);
  duckdb_je_prof_prefork0((tsdn_t *)tsd);
  duckdb_je_background_thread_prefork1((tsdn_t *)tsd);
  uVar1 = 0;
  do {
    if ((int)uVar1 == 9) {
      duckdb_je_prof_prefork1((tsdn_t *)tsd);
      duckdb_je_stats_prefork((tsdn_t *)tsd);
      duckdb_je_tsd_prefork(tsd);
      return;
    }
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      if (duckdb_je_arenas[uVar3].repr != (void *)0x0) {
        (*(code *)((long)&DAT_020c8950 + (long)(int)(&DAT_020c8950)[uVar1]))();
        return;
      }
    }
    uVar1 = (ulong)((int)uVar1 + 1);
  } while( true );
}

Assistant:

void
jemalloc_prefork(void)
#else
JEMALLOC_EXPORT void
_malloc_prefork(void)
#endif
{
	tsd_t *tsd;
	unsigned i, j, narenas;
	arena_t *arena;

#ifdef JEMALLOC_MUTEX_INIT_CB
	if (!malloc_initialized()) {
		return;
	}
#endif
	assert(malloc_initialized());

	tsd = tsd_fetch();

	narenas = narenas_total_get();

	witness_prefork(tsd_witness_tsdp_get(tsd));
	/* Acquire all mutexes in a safe order. */
	ctl_prefork(tsd_tsdn(tsd));
	tcache_prefork(tsd_tsdn(tsd));
	malloc_mutex_prefork(tsd_tsdn(tsd), &arenas_lock);
	if (have_background_thread) {
		background_thread_prefork0(tsd_tsdn(tsd));
	}
	prof_prefork0(tsd_tsdn(tsd));
	if (have_background_thread) {
		background_thread_prefork1(tsd_tsdn(tsd));
	}
	/* Break arena prefork into stages to preserve lock order. */
	for (i = 0; i < 9; i++) {
		for (j = 0; j < narenas; j++) {
			if ((arena = arena_get(tsd_tsdn(tsd), j, false)) !=
			    NULL) {
				switch (i) {
				case 0:
					arena_prefork0(tsd_tsdn(tsd), arena);
					break;
				case 1:
					arena_prefork1(tsd_tsdn(tsd), arena);
					break;
				case 2:
					arena_prefork2(tsd_tsdn(tsd), arena);
					break;
				case 3:
					arena_prefork3(tsd_tsdn(tsd), arena);
					break;
				case 4:
					arena_prefork4(tsd_tsdn(tsd), arena);
					break;
				case 5:
					arena_prefork5(tsd_tsdn(tsd), arena);
					break;
				case 6:
					arena_prefork6(tsd_tsdn(tsd), arena);
					break;
				case 7:
					arena_prefork7(tsd_tsdn(tsd), arena);
					break;
				case 8:
					arena_prefork8(tsd_tsdn(tsd), arena);
					break;
				default: not_reached();
				}
			}
		}

	}
	prof_prefork1(tsd_tsdn(tsd));
	stats_prefork(tsd_tsdn(tsd));
	tsd_prefork(tsd);
}